

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# two_level_iterator.cc
# Opt level: O0

void __thiscall leveldb::anon_unknown_7::TwoLevelIterator::~TwoLevelIterator(TwoLevelIterator *this)

{
  long lVar1;
  TwoLevelIterator *in_RDI;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  ~TwoLevelIterator(in_RDI);
  operator_delete(in_RDI,0xb0);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

TwoLevelIterator::~TwoLevelIterator() = default;